

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,Header *hd)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  pointer pdVar5;
  uint uVar6;
  Format FVar7;
  ostream *poVar8;
  RealDescriptor *rd;
  int i;
  long lVar9;
  fmtflags __old;
  
  lVar9 = *(long *)os;
  lVar3 = *(long *)(lVar9 + -0x18);
  uVar1 = *(uint *)(os + lVar3 + 0x18);
  *(uint *)(os + lVar3 + 0x18) = uVar1 | 0x100;
  lVar9 = *(long *)(lVar9 + -0x18);
  uVar4 = *(undefined8 *)(os + lVar9 + 8);
  *(undefined8 *)(os + lVar9 + 8) = 0x10;
  poVar8 = (ostream *)std::ostream::operator<<(os,hd->m_vers);
  std::operator<<(poVar8,'\n');
  poVar8 = (ostream *)std::ostream::operator<<(os,hd->m_how);
  std::operator<<(poVar8,'\n');
  poVar8 = (ostream *)std::ostream::operator<<(os,hd->m_ncomp);
  std::operator<<(poVar8,'\n');
  iVar2 = (hd->m_ngrow).vect[0];
  if (((hd->m_ngrow).vect[1] == iVar2) && ((hd->m_ngrow).vect[2] == iVar2)) {
    poVar8 = (ostream *)std::ostream::operator<<(os,iVar2);
  }
  else {
    poVar8 = operator<<(os,&hd->m_ngrow);
  }
  std::operator<<(poVar8,'\n');
  BoxArray::writeOn(&hd->m_ba,os);
  std::operator<<(os,'\n');
  operator<<(os,&hd->m_fod);
  std::operator<<(os,'\n');
  uVar6 = hd->m_vers;
  if ((uVar6 | 2) == 3) {
    operator<<(os,&hd->m_min);
    std::operator<<(os,'\n');
    operator<<(os,&hd->m_max);
    std::operator<<(os,'\n');
    uVar6 = hd->m_vers;
  }
  if (uVar6 == 4) {
    for (lVar9 = 0;
        pdVar5 = (hd->m_famin).super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start,
        lVar9 < (long)(hd->m_famin).super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar5 >> 3; lVar9 = lVar9 + 1) {
      poVar8 = std::ostream::_M_insert<double>(pdVar5[lVar9]);
      std::operator<<(poVar8,',');
    }
    std::operator<<(os,'\n');
    for (lVar9 = 0;
        pdVar5 = (hd->m_famax).super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start,
        lVar9 < (long)(hd->m_famax).super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar5 >> 3; lVar9 = lVar9 + 1) {
      poVar8 = std::ostream::_M_insert<double>(pdVar5[lVar9]);
      std::operator<<(poVar8,',');
    }
    std::operator<<(os,'\n');
    uVar6 = hd->m_vers;
  }
  if (uVar6 - 2 < 3) {
    FVar7 = FArrayBox::getFormat();
    if (FVar7 == FAB_NATIVE) {
      rd = FPC::NativeRealDescriptor();
    }
    else {
      FVar7 = FArrayBox::getFormat();
      if (FVar7 == FAB_NATIVE_32) {
        rd = FPC::Native32RealDescriptor();
      }
      else {
        FVar7 = FArrayBox::getFormat();
        if (FVar7 != FAB_IEEE_32) goto LAB_004fc382;
        rd = FPC::Ieee32NormalRealDescriptor();
      }
    }
    poVar8 = operator<<(os,rd);
    std::operator<<(poVar8,'\n');
  }
LAB_004fc382:
  lVar9 = *(long *)os;
  *(uint *)(os + *(long *)(lVar9 + -0x18) + 0x18) = uVar1;
  *(long *)(os + *(long *)(lVar9 + -0x18) + 8) = (long)(int)uVar4;
  if (*(int *)(os + *(long *)(lVar9 + -0x18) + 0x20) != 0) {
    Error_host("Write of VisMF::Header failed");
  }
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream        &os,
            const VisMF::Header &hd)
{
    //
    // Up the precision for the Reals in m_min and m_max.
    // Force it to be written in scientific notation to match fParallel code.
    //
    std::ios::fmtflags oflags = os.flags();
    os.setf(std::ios::floatfield, std::ios::scientific);
    int oldPrec(os.precision(16));

    os << hd.m_vers     << '\n';
    os << int(hd.m_how) << '\n';
    os << hd.m_ncomp    << '\n';
    if (hd.m_ngrow == hd.m_ngrow[0]) {
        os << hd.m_ngrow[0] << '\n';
    } else {
        os << hd.m_ngrow    << '\n';
    }

    hd.m_ba.writeOn(os); os << '\n';

    os << hd.m_fod      << '\n';

    if(hd.m_vers == VisMF::Header::Version_v1 ||
       hd.m_vers == VisMF::Header::NoFabHeaderMinMax_v1)
    {
      os << hd.m_min      << '\n';
      os << hd.m_max      << '\n';
    }

    if(hd.m_vers == VisMF::Header::NoFabHeaderFAMinMax_v1) {
      BL_ASSERT(hd.m_famin.size() == hd.m_ncomp);
      BL_ASSERT(hd.m_famin.size() == hd.m_famax.size());
      for(int i(0); i < hd.m_famin.size(); ++i) {
        os << hd.m_famin[i] << ',';
      }
      os << '\n';
      for(int i(0); i < hd.m_famax.size(); ++i) {
        os << hd.m_famax[i] << ',';
      }
      os << '\n';
    }

    if(hd.m_vers == VisMF::Header::NoFabHeader_v1       ||
       hd.m_vers == VisMF::Header::NoFabHeaderMinMax_v1 ||
       hd.m_vers == VisMF::Header::NoFabHeaderFAMinMax_v1)
    {
      if(FArrayBox::getFormat() == FABio::FAB_NATIVE) {
        os << FPC::NativeRealDescriptor() << '\n';
      } else if(FArrayBox::getFormat() == FABio::FAB_NATIVE_32) {
        os << FPC::Native32RealDescriptor() << '\n';
      } else if(FArrayBox::getFormat() == FABio::FAB_IEEE_32) {
        os << FPC::Ieee32NormalRealDescriptor() << '\n';
      }
    }

    os.flags(oflags);
    os.precision(oldPrec);

    if( ! os.good()) {
        amrex::Error("Write of VisMF::Header failed");
    }

    return os;
}